

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O3

bool __thiscall tcmalloc::TrivialOnce::RunOnce<void(*)()>(TrivialOnce *this,_func_void *body)

{
  bool bVar1;
  SpinLockHolder local_28;
  SpinLockHolder h;
  
  if (this->done_flag_ == 1) {
    bVar1 = false;
  }
  else {
    local_28.lock_ = (SpinLock *)&this->lock_storage_;
    LOCK();
    bVar1 = *(int *)(this->lock_storage_).bytes_ == 0;
    if (bVar1) {
      *(undefined4 *)(this->lock_storage_).bytes_ = 1;
    }
    UNLOCK();
    if (!bVar1) {
      SpinLock::SlowLock(local_28.lock_);
    }
    bVar1 = this->done_flag_ != 1;
    if (bVar1) {
      (*body)();
      this->done_flag_ = 1;
    }
    SpinLockHolder::~SpinLockHolder(&local_28);
  }
  return bVar1;
}

Assistant:

bool RunOnce(Body body) {
    auto done_atomic = reinterpret_cast<std::atomic<int>*>(&done_flag_);
    if (done_atomic->load(std::memory_order_acquire) == 1) {
      return false;
    }

    SpinLockHolder h(lock_storage_.get());

    if (done_atomic->load(std::memory_order_relaxed) == 1) {
      // barrier provided by lock
      return false;
    }
    body();
    done_atomic->store(1, std::memory_order_release);
    return true;
  }